

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

Path * __thiscall Pathie::Path::prune(Path *__return_storage_ptr__,Path *this)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  string newpath;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  Path *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98 = local_88;
  pcVar1 = (this->m_path)._M_dataplus._M_p;
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (this->m_path)._M_string_length);
  uVar3 = 0;
  do {
    while( true ) {
      uVar3 = std::__cxx11::string::find((char *)&local_98,0x10f11d,uVar3);
      if (uVar3 == 0xffffffffffffffff) {
        if (local_90 == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x10f2cf);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_98,local_98 + local_90);
        Path(local_78,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        return local_78;
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_98);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (iVar2 == 0) break;
      if ((uVar3 + 2 < local_90) && (local_98[uVar3 + 2] != '/')) {
LAB_00109766:
        uVar3 = uVar3 + 1;
      }
      else {
        std::__cxx11::string::erase((ulong)&local_98,uVar3);
LAB_001096dc:
        uVar3 = 0;
        if (local_90 == 0) {
          std::__cxx11::string::append((char *)&local_98);
          uVar3 = 0;
        }
      }
    }
    if ((uVar3 + 3 < local_90) && (local_98[uVar3 + 3] != '/')) goto LAB_00109766;
    if (uVar3 == 0) {
      std::__cxx11::string::erase((ulong)&local_98,0);
      goto LAB_001096dc;
    }
    uVar3 = std::__cxx11::string::rfind((char *)&local_98,0x10f1b8,uVar3 - 1);
    if (uVar3 == 0xffffffffffffffff) {
      uVar3 = 0;
    }
    std::__cxx11::string::erase((ulong)&local_98,uVar3);
    uVar3 = 0;
  } while( true );
}

Assistant:

Path Path::prune() const
{
  std::string newpath(m_path); // copy
  size_t pos = 0;
  while((pos = newpath.find("/.", pos)) != string::npos) { // assignment intended
    if (newpath.substr(pos, 3) == "/..") {

      // Weird path like /..foo or foo/..bar, which are NOT relative paths
      if (newpath.length() > pos + 3 && newpath[pos + 3] != '/') {
        // Do not reset `pos' -- this has to stay. Advance to the next char.
        pos++;
        continue;
      }

      if (pos == 0) {
        // /.. at beginning of string, replace with root / (/ on Windows is root on current drive)
        newpath.erase(pos, 3);

        // Whoops -- the entire string was just "/.."
        if (newpath.empty()) {
          newpath.append("/");
        }
      }
#ifdef _WIN32
      // Cater for paths with drive X:/ on Windows
      else if (pos == 2 && newpath[1] == ':') { // ":" is on Windows only allowed at pos 1, where it signifies the preceding char is a drive letter
        // X:/. or X:/.. at beginning of string
        if(newpath.length() > 4 && newpath[4] == '.') { // X:/..
          // Prevent special case "X:/..foo", which is directory "..foo" under the root
          if (newpath.length() <= 5 || newpath[5] != '/') {
            // X:/.. or X:/../foo/bar at beginning of string, replace with drive root
            newpath.erase(pos, 3);
          }
        }
        else { // X:/./foo/bar X:/..foo
          // Prevent special case "X:/.foo", which is directory ".foo" under the root
          if (newpath.length() <= 4 || newpath[4] != '/') {
            // X:/. or X:/./foo/bar at beginning of string, replace with drive root
            newpath.erase(pos, 2);
          }
        }

        if (newpath.length() == 2) {
          // Whoops -- the entire string was just "X:/.." or "X:/."
          newpath.append("/");
        }
      }
#endif
      else {
        size_t pos2 = 0;
        if ((pos2 = newpath.rfind("/", pos - 1)) != string::npos) { // assignment intended
          // Remove parent directory.
          newpath.erase(pos2, pos - pos2 + 3);
        }
        else { // ../ for relative path (as in foo/../baz.txt)
          newpath.erase(0, pos + 4);
        }
      }
    }
    else { // Single /.

      // Weird path like /..foo or foo/..bar, which are NOT relative paths
      if (newpath.length() > pos + 2 && newpath[pos + 2] != '/') {
        // Do not reset `pos' -- this has to stay. Advance to the next char.
        pos++;
        continue;
      }

      newpath.erase(pos, 2);

      // Whoops -- the entire string was just "/."
      if (newpath.empty()) {
        newpath.append("/");
      }
    }